

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::
TestFactoryImpl<optTyped_otherTypeCopyAssignmentEmptyForEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>_>
::CreateTest(TestFactoryImpl<optTyped_otherTypeCopyAssignmentEmptyForEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>_>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x28);
  Test::Test(this_00);
  this_00[1]._vptr_Test = (_func_int **)0x7b;
  this_00[1].gtest_flag_saver_.ptr_ = (GTestFlagSaver *)0x3e7;
  this_00[2]._vptr_Test = (_func_int **)0x3e70000007b;
  this_00->_vptr_Test = (_func_int **)&PTR__Test_001fe440;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }